

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O2

void __thiscall Wasm::WasmSignature::FinalizeSignature(WasmSignature *this)

{
  ushort uVar1;
  WasmType *pWVar2;
  code *pcVar3;
  bool bVar4;
  ArgSlot AVar5;
  Local LVar6;
  undefined4 *puVar7;
  WasmCompilationException *this_00;
  ulong uVar8;
  ArgSlot i;
  ulong uVar9;
  ushort uVar10;
  ArgSlot index;
  
  if (this->m_resultsCount < 2) {
    if (this->m_resultsCount == 1) {
      LVar6 = GetResult(this,0);
      uVar8 = (ulong)LVar6;
    }
    else {
      uVar8 = 0;
    }
    if (this->m_paramSize != 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                         ,0xab,"(m_paramSize == Js::Constants::InvalidArgSlot)",
                         "m_paramSize == Js::Constants::InvalidArgSlot");
      if (!bVar4) goto LAB_00d75d61;
      *puVar7 = 0;
    }
    if (this->m_shortSig != 0xffffffffffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                         ,0xac,"(m_shortSig == Js::Constants::InvalidSignature)",
                         "m_shortSig == Js::Constants::InvalidSignature");
      if (!bVar4) {
LAB_00d75d61:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    uVar1 = this->m_paramsCount;
    this->m_paramSize = 0;
    uVar10 = 0;
    index = 0;
    while (uVar1 != index) {
      AVar5 = GetParamSize(this,index);
      index = index + 1;
      bVar4 = CARRY2(uVar10,AVar5);
      uVar10 = uVar10 + AVar5;
      this->m_paramSize = uVar10;
      if (bVar4) {
        this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException(this_00,L"Argument size too big");
        __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
    }
    if (uVar1 < 0x15) {
      pWVar2 = (this->m_params).ptr;
      uVar8 = this->m_shortSig << 3 | uVar8;
      this->m_shortSig = uVar8;
      for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        uVar8 = uVar8 << 3 | (long)(int)(pWVar2[uVar9] - FirstLocalType);
        this->m_shortSig = uVar8;
      }
    }
  }
  return;
}

Assistant:

void WasmSignature::FinalizeSignature()
{
    if (GetResultCount() > 1)
    {
        // Do not support short signature with multiple returns at this time
        return;
    }
    Local resultType = GetResultCount() == 1 ? GetResult(0) : WasmTypes::Void;
    Assert(m_paramSize == Js::Constants::InvalidArgSlot);
    Assert(m_shortSig == Js::Constants::InvalidSignature);
    const Js::ArgSlot paramCount = GetParamCount();
    m_paramSize = 0;
    for (Js::ArgSlot i = 0; i < paramCount; ++i)
    {
        if (ArgSlotMath::Add(m_paramSize, GetParamSize(i), &m_paramSize))
        {
            throw WasmCompilationException(_u("Argument size too big"));
        }
    }

    // 3 bits for result type, 3 for each arg
    const uint32 nBitsForResult = 3;
#ifdef ENABLE_WASM_SIMD
    const uint32 nBitsForArgs = 3;
#else
    // We can drop 1 bit by excluding void
    const uint32 nBitsForArgs = 2;
#endif
    CompileAssert(Local::Void == 0);
    // Make sure we can encode all types (including void) with the number of bits reserved
    CompileAssert(Local::Limit <= (1 << nBitsForResult));
    // Make sure we can encode all types (excluding void) with the number of bits reserved
    CompileAssert(Local::Limit - 1 <= (1 << nBitsForArgs));

    ::Math::RecordOverflowPolicy sigOverflow;
    const uint32 bitsRequiredForSig = UInt32Math::MulAdd<nBitsForArgs, nBitsForResult>((uint32)paramCount, sigOverflow);
    if (sigOverflow.HasOverflowed())
    {
        return;
    }

    // we don't need to reserve a sentinel bit because there is no result type with value of 7
    CompileAssert(Local::Limit <= 0b111);
    const uint32 nAvailableBits = sizeof(m_shortSig) * 8;
    if (bitsRequiredForSig <= nAvailableBits)
    {
        // Append the result type to the signature
        m_shortSig = (m_shortSig << nBitsForResult) | resultType;
        for (Js::ArgSlot i = 0; i < paramCount; ++i)
        {
            // Append the param type to the signature, -1 to exclude Void
            m_shortSig = (m_shortSig << nBitsForArgs) | (m_params[i] - 1);
        }
    }
}